

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::reportInvalidArguments(ConsoleReporter *this,string *arg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"Invalid Filter: ");
  poVar1 = std::operator<<(poVar1,(string *)arg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ConsoleReporter::reportInvalidArguments(std::string const &arg) {
                stream << "Invalid Filter: " << arg << std::endl;
            }